

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckOperator.cxx
# Opt level: O1

bool __thiscall
kws::Parser::FindOperator
          (Parser *this,char *op,uint before,uint after,unsigned_long maxSize,
          bool doNotCheckInsideParenthesis)

{
  string *psVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  size_t pos;
  size_t sVar6;
  long lVar7;
  unsigned_long uVar8;
  char *pcVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  pointer pcVar11;
  size_t pos_00;
  size_t sVar12;
  bool bVar13;
  string currentLine;
  string previousLine;
  uint local_100;
  uint local_fc;
  undefined1 local_e0 [24];
  char local_c8 [8];
  char *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  undefined8 local_a8;
  char *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  string local_90;
  string local_70;
  string local_50;
  
  psVar1 = &this->m_BufferNoComment;
  strlen(op);
  local_a0 = op;
  pos = std::__cxx11::string::find((char *)psVar1,(ulong)op,0);
  if (pos == 0xffffffffffffffff) {
    bVar5 = 1;
  }
  else {
    local_98 = &local_50.field_2;
    local_a8 = 0;
    do {
      bVar13 = true;
      local_100 = 0;
      local_fc = 0;
      if (1 < (long)pos) {
        local_fc = 0;
        bVar3 = true;
        bVar13 = true;
        sVar12 = pos;
        do {
          pos_00 = sVar12 - 1;
          cVar2 = (psVar1->_M_dataplus)._M_p[pos_00];
          if ((cVar2 == '\n') || (cVar2 == '\r')) {
            lVar7 = GetLineNumber(this,pos_00,true);
            GetLine_abi_cxx11_((string *)local_e0,this,lVar7 - 1);
            uVar8 = GetLineNumber(this,pos_00,true);
            GetLine_abi_cxx11_(&local_90,this,uVar8);
            pcVar11 = (pointer)(local_e0._8_8_ + local_90._M_string_length);
            bVar13 = bVar3;
            if (maxSize < pcVar11) {
              bVar13 = false;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p);
            }
            if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
              operator_delete((void *)local_e0._0_8_);
            }
            bVar3 = bVar13;
            if (maxSize < pcVar11) break;
          }
          else {
            if (cVar2 != ' ') break;
            local_fc = local_fc + 1;
          }
          bVar4 = 2 < (long)sVar12;
          sVar12 = pos_00;
        } while (bVar4);
      }
      sVar6 = strlen(local_a0);
      sVar12 = sVar6 + pos;
      if ((long)sVar12 < (long)(this->m_BufferNoComment)._M_string_length) {
        local_100 = 0;
        do {
          cVar2 = (psVar1->_M_dataplus)._M_p[sVar12];
          if (cVar2 == '\n') {
LAB_00156867:
            lVar7 = GetLineNumber(this,sVar12,true);
            GetLine_abi_cxx11_((string *)local_e0,this,lVar7 - 1);
            uVar8 = GetLineNumber(this,sVar12,true);
            GetLine_abi_cxx11_(&local_90,this,uVar8);
            pcVar11 = (pointer)(local_e0._8_8_ + local_90._M_string_length);
            if (maxSize < pcVar11) {
              bVar13 = false;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p);
            }
            if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
              operator_delete((void *)local_e0._0_8_);
            }
            if (maxSize < pcVar11) break;
          }
          else {
            if (cVar2 != ' ') {
              if (cVar2 == '\r') goto LAB_00156867;
              break;
            }
            local_100 = local_100 + 1;
          }
          sVar12 = sVar12 + 1;
        } while ((long)sVar12 < (long)(this->m_BufferNoComment)._M_string_length);
      }
      if ((bVar13) && (local_100 != after || local_fc != before)) {
        lVar7 = std::__cxx11::string::find((char *)psVar1,0x178e6b,pos - 0xb);
        bVar13 = pos != lVar7 + 8U;
        if (bVar13 && doNotCheckInsideParenthesis) {
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
          bVar3 = IsBetweenCharsFast(this,'(',')',pos,false,&local_50);
          if (bVar3) goto LAB_001569b2;
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
          bVar4 = IsBetweenQuote(this,pos,false,&local_70);
          bVar4 = !bVar4;
          bVar3 = true;
        }
        else {
LAB_001569b2:
          bVar3 = false;
          bVar4 = false;
        }
        if ((bVar3) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2)) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if ((bVar13 && doNotCheckInsideParenthesis) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2)) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if (bVar4) {
          local_c8 = (char  [8])&local_b8;
          local_c0 = (char *)0x0;
          local_b8._M_local_buf[0] = '\0';
          local_e0._0_8_ = GetLineNumber(this,pos,true);
          local_e0._16_8_ = 0x17;
          local_e0._8_8_ = local_e0._0_8_;
          std::__cxx11::string::_M_replace((ulong)local_c8,0,local_c0,0x178ae8);
          std::__cxx11::string::append(local_c8);
          pcVar9 = (char *)operator_new__(10);
          snprintf(pcVar9,10,"%d",(ulong)local_fc);
          std::__cxx11::string::append(local_c8);
          std::__cxx11::string::append(local_c8);
          snprintf(pcVar9,10,"%d",(ulong)before);
          std::__cxx11::string::append(local_c8);
          std::__cxx11::string::append(local_c8);
          snprintf(pcVar9,10,"%d",(ulong)local_100);
          std::__cxx11::string::append(local_c8);
          std::__cxx11::string::append(local_c8);
          snprintf(pcVar9,10,"%d",(ulong)after);
          std::__cxx11::string::append(local_c8);
          std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                    (&this->m_ErrorList,(value_type *)local_e0);
          operator_delete__(pcVar9);
          paVar10 = &local_b8;
          if (local_c8 != (char  [8])paVar10) {
            operator_delete((void *)local_c8);
            paVar10 = extraout_RAX;
          }
          local_a8 = CONCAT71((int7)((ulong)paVar10 >> 8),1);
        }
      }
      pcVar9 = local_a0;
      strlen(local_a0);
      pos = std::__cxx11::string::find((char *)psVar1,(ulong)pcVar9,pos + 1);
    } while (pos != 0xffffffffffffffff);
    bVar5 = (byte)local_a8 ^ 1;
  }
  return (bool)(bVar5 & 1);
}

Assistant:

bool Parser::FindOperator(const char* op,unsigned int before, 
                          unsigned int after,
                          unsigned long maxSize,
                          bool doNotCheckInsideParenthesis
                          )
{
  bool hasErrors = false;
  long int pos = 0;
  size_t operatorPos = m_BufferNoComment.find(op,pos);
  while(operatorPos != std::string::npos) 
    {
    bool showError=true;
    // Check number of space before
    unsigned int bef = 0;
    long int i = static_cast<long int>(operatorPos)-1;
    while((i>0) && ((m_BufferNoComment[i] == ' ')
       || (m_BufferNoComment[i] == '\r')
       || (m_BufferNoComment[i] == '\n'))
       )
      {
      if((m_BufferNoComment[i] != '\r')
       && (m_BufferNoComment[i] != '\n'))
        {
        bef++;
        }
      else
        {
        // check if the sum of the two lines is higher than the maximum length
        std::string currentLine = this->GetLine(this->GetLineNumber(i,true)-1);
        std::string previousLine = this->GetLine(this->GetLineNumber(i,true));
        auto sum = static_cast<unsigned long>(currentLine.size() +
                                              previousLine.size());
        if(sum>maxSize)
          {
          showError = false;
          break;
          }
        }
      i--;
      }

    // Check number of space after
    unsigned int aft = 0;
    i = static_cast<long int>(operatorPos+strlen(op));
    while((i<(long int)m_BufferNoComment.size())
           && ((m_BufferNoComment[i] == ' ')
           || (m_BufferNoComment[i] == '\r')
           || (m_BufferNoComment[i] == '\n')
           )
           )
      {
      if((m_BufferNoComment[i] == '\r')
        || (m_BufferNoComment[i] == '\n'))
        {
        // check if the sum of the two lines is higher than the maximum length
        std::string currentLine = this->GetLine(this->GetLineNumber(i,true)-1);
        std::string nextLine = this->GetLine(this->GetLineNumber(i,true));
        auto sum =
            static_cast<unsigned long>(currentLine.size() + nextLine.size());
        if(sum>maxSize)
          {
          showError = false;
          break;
          }
        }
      else
        {
        aft++;
        }
      i++;
      }
   
    if(showError  && (bef != before || aft != after))
      {
      // we make sure that the keyword operator is not defined right before
      if(operatorPos != m_BufferNoComment.find("operator",operatorPos-11)+8
        && (doNotCheckInsideParenthesis && !this->IsBetweenCharsFast('(',')',operatorPos,false)
        && !this->IsBetweenQuote(operatorPos,false)
        ) 
        )
        {
        Error error;
        error.line = this->GetLineNumber(operatorPos,true);
        error.line2 = error.line;
        error.number = OPERATOR;
        error.description = "Spaces around operator are wrong: ";
        error.description += "before = ";
        constexpr size_t length = 10;
        char* val = new char[length];
        snprintf(val,length,"%d",bef);
        error.description += val;
        error.description += " v.s ";
        snprintf(val,length,"%d",before);
        error.description += val;
        error.description += " ,after = ";
        snprintf(val,length,"%d",aft);
        error.description += val;
        error.description += " v.s ";
        snprintf(val,length,"%d",after);
        error.description += val;
        m_ErrorList.push_back(error);
        delete [] val;
        hasErrors = true;
        }
      }
    pos = static_cast<long int>(operatorPos)+1;
    operatorPos = m_BufferNoComment.find(op,operatorPos+1);  
    }
  return !hasErrors;
}